

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Switch * __thiscall MixedArena::alloc<wasm::Switch>(MixedArena *this)

{
  Switch *pSVar1;
  
  pSVar1 = (Switch *)allocSpace(this,0x50,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression._id = SwitchId;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data = (Name *)0x0;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements = 0;
  (pSVar1->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.allocatedElements = 0
  ;
  (pSVar1->targets).allocator = this;
  (pSVar1->default_).super_IString.str._M_len = 0;
  (pSVar1->default_).super_IString.str._M_str = (char *)0x0;
  pSVar1->value = (Expression *)0x0;
  pSVar1->condition = (Expression *)0x0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)5>).super_Expression.type.id = 1;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }